

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O0

float star(int x,int y,float t)

{
  float fVar1;
  float fVar2;
  double dVar3;
  undefined4 local_38;
  undefined4 local_34;
  float yalpha;
  float xalpha;
  float salpha;
  float dist;
  float k;
  float i;
  float c;
  float t_local;
  int y_local;
  int x_local;
  
  dVar3 = sin((double)t * 6.283185307179586);
  fVar1 = (float)dVar3 * 0.25 + 0.75;
  local_38 = fVar1 * 3.0;
  dVar3 = sqrt((double)(((float)x - 32.0) * ((float)x - 32.0) +
                       ((float)y - 32.0) * ((float)y - 32.0)));
  fVar2 = 1.0 - (float)dVar3 / 32.0;
  if (((float)x != 32.0) || (NAN((float)x))) {
    local_34 = local_38 / ABS((float)x - 32.0);
  }
  else {
    local_34 = 32.0;
  }
  if (((float)y != 32.0) || (NAN((float)y))) {
    local_38 = local_38 / ABS((float)y - 32.0);
  }
  else {
    local_38 = 32.0;
  }
  dVar3 = (double)(fVar1 * fVar2 * 0.2 + fVar2 * local_34 * local_38);
  if (1.0 <= dVar3) {
    dVar3 = 1.0;
  }
  if (dVar3 <= 0.0) {
    dVar3 = 0.0;
  }
  return (float)dVar3;
}

Assistant:

static float star(int x, int y, float t)
{
    const float c = 64 / 2.f;

    const float i = (0.25f * (float) sin(2.f * M_PI * t) + 0.75f);
    const float k = 64 * 0.046875f * i;

    const float dist = (float) sqrt((x - c) * (x - c) + (y - c) * (y - c));

    const float salpha = 1.f - dist / c;
    const float xalpha = (float) x == c ? c : k / (float) fabs(x - c);
    const float yalpha = (float) y == c ? c : k / (float) fabs(y - c);

    return (float) fmax(0.f, fmin(1.f, i * salpha * 0.2f + salpha * xalpha * yalpha));
}